

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O2

type __thiscall
boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
          (boost *this,JointPolicyPureVectorForClusteredBG *arg1)

{
  undefined1 *puVar1;
  shared_count extraout_RDX;
  type tVar2;
  shared_ptr<JointPolicyPureVectorForClusteredBG> pt;
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_30;
  
  shared_ptr<JointPolicyPureVectorForClusteredBG>::
  shared_ptr<JointPolicyPureVectorForClusteredBG,boost::detail::sp_inplace_tag<boost::detail::sp_ms_deleter<JointPolicyPureVectorForClusteredBG>>>
            (&local_30,0);
  puVar1 = (undefined1 *)
           shared_ptr<JointPolicyPureVectorForClusteredBG>::_internal_get_untyped_deleter(&local_30)
  ;
  JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
            ((JointPolicyPureVectorForClusteredBG *)(puVar1 + 8),arg1);
  *puVar1 = 1;
  *(JointPolicyPureVectorForClusteredBG **)this =
       (JointPolicyPureVectorForClusteredBG *)(puVar1 + 8);
  *(sp_counted_base **)(this + 8) = local_30.pn.pi_;
  if (local_30.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_30.pn.pi_)->use_count_ = (local_30.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  detail::shared_count::~shared_count(&local_30.pn);
  tVar2.pn.pi_ = extraout_RDX.pi_;
  tVar2.px = (element_type *)this;
  return tVar2;
}

Assistant:

typename boost::detail::sp_if_not_array< T >::type make_shared( Arg1 && arg1, Args && ... args )
{
    boost::shared_ptr< T > pt( static_cast< T* >( 0 ), BOOST_SP_MSD( T ) );

    boost::detail::sp_ms_deleter< T > * pd = static_cast<boost::detail::sp_ms_deleter< T > *>( pt._internal_get_untyped_deleter() );

    void * pv = pd->address();

    ::new( pv ) T( boost::detail::sp_forward<Arg1>( arg1 ), boost::detail::sp_forward<Args>( args )... );
    pd->set_initialized();

    T * pt2 = static_cast< T* >( pv );

    boost::detail::sp_enable_shared_from_this( &pt, pt2, pt2 );
    return boost::shared_ptr< T >( pt, pt2 );
}